

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O0

bool operator==(CExtPubKey *a,CExtPubKey *b)

{
  bool bVar1;
  base_blob<256U> *in_RSI;
  CPubKey *in_RDI;
  long in_FS_OFFSET;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  bool bVar2;
  CPubKey *a_00;
  
  a_00 = *(CPubKey **)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  if (((in_RDI->vch[4] == (in_RSI->m_data)._M_elems[4]) &&
      (bVar2 = false, *(int *)(in_RDI->vch + 5) == *(int *)((in_RSI->m_data)._M_elems + 5))) &&
     (bVar2 = false, *(int *)(in_RDI->vch + 0xc) == *(int *)((in_RSI->m_data)._M_elems + 0xc))) {
    bVar1 = operator==(in_RSI,(base_blob<256U> *)
                              (ulong)CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0));
    bVar2 = false;
    if (bVar1) {
      bVar2 = operator==(a_00,in_RDI);
    }
  }
  if (*(CPubKey **)(in_FS_OFFSET + 0x28) != a_00) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool operator==(const CExtPubKey &a, const CExtPubKey &b)
    {
        return a.nDepth == b.nDepth &&
            memcmp(a.vchFingerprint, b.vchFingerprint, sizeof(vchFingerprint)) == 0 &&
            a.nChild == b.nChild &&
            a.chaincode == b.chaincode &&
            a.pubkey == b.pubkey;
    }